

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register.cpp
# Opt level: O1

bool __thiscall
bidfx_public_api::price::pixie::SubjectSetRegister::IsCurrentlySubscribed
          (SubjectSetRegister *this,Subject *subject_to_find)

{
  iterator iVar1;
  bool bVar2;
  unique_lock<std::mutex> lck;
  unique_lock<std::mutex> local_28;
  
  local_28._M_owns = false;
  local_28._M_device = &this->mutex_;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  iVar1 = std::
          _Rb_tree<bidfx_public_api::price::subject::Subject,_std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>,_std::_Select1st<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>_>
          ::find(&(this->subject_state_)._M_t,subject_to_find);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->subject_state_)._M_t._M_impl.super__Rb_tree_header
     ) {
    bVar2 = false;
  }
  else {
    bVar2 = *(int *)&iVar1._M_node[1]._M_right != 0;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return bVar2;
}

Assistant:

bool SubjectSetRegister::IsCurrentlySubscribed(const Subject& subject_to_find)
{
    std::unique_lock<std::mutex> lck(mutex_);
    auto state = subject_state_.find(subject_to_find);
    return !(state == subject_state_.end() || state->second.GetState() == STATE_UNSUBSCRIBED);
}